

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall
cmCTest::OutputTestErrors(cmCTest *this,vector<char,_std::allocator<char>_> *process_output)

{
  bool bVar1;
  char *pcVar2;
  ostream *this_00;
  void *this_01;
  string local_1e8 [32];
  undefined1 local_1c8 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_39;
  string local_38 [8];
  string test_outputs;
  vector<char,_std::allocator<char>_> *process_output_local;
  cmCTest *this_local;
  
  test_outputs.field_2._8_8_ = process_output;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"\n*** Test Failed:\n",&local_39);
  std::allocator<char>::~allocator(&local_39);
  bVar1 = std::vector<char,_std::allocator<char>_>::empty
                    ((vector<char,_std::allocator<char>_> *)test_outputs.field_2._8_8_);
  if (!bVar1) {
    pcVar2 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)test_outputs.field_2._8_8_);
    std::vector<char,_std::allocator<char>_>::size
              ((vector<char,_std::allocator<char>_> *)test_outputs.field_2._8_8_);
    std::__cxx11::string::append((char *)local_38,(ulong)pcVar2);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  this_00 = std::operator<<((ostream *)local_1c8,local_38);
  this_01 = (void *)std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_01,std::flush<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  Log(this,2,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
      ,0xc7d,pcVar2,false);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmCTest::OutputTestErrors(std::vector<char> const& process_output)
{
  std::string test_outputs("\n*** Test Failed:\n");
  if (!process_output.empty()) {
    test_outputs.append(process_output.data(), process_output.size());
  }
  cmCTestLog(this, HANDLER_OUTPUT, test_outputs << std::endl << std::flush);
}